

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall mat_lib::vector<double>::vector(vector<double> *this,list *vec)

{
  size_t sVar1;
  proxy<boost::python::api::item_policies> local_60;
  object local_50;
  extract<double> local_48;
  result_type local_28;
  ulong local_20;
  size_t i;
  list *vec_local;
  vector<double> *this_local;
  
  i = (size_t)vec;
  vec_local = (list *)this;
  sVar1 = boost::python::len((object *)vec);
  this->max_size__ = sVar1;
  std::vector<double,_std::allocator<double>_>::vector(&this->container__);
  this->format__ = fixed;
  this->fractional_digits__ = 6;
  for (local_20 = 0; local_20 < this->max_size__; local_20 = local_20 + 1) {
    boost::python::api::object_operators<boost::python::api::object>::operator[]<unsigned_long>
              ((object_operators<boost::python::api::object> *)&local_60,(unsigned_long *)vec);
    boost::python::api::proxy::operator_cast_to_object((proxy *)&local_50);
    boost::python::extract<double>::extract(&local_48,&local_50);
    local_28 = boost::python::extract::operator_cast_to_double((extract *)&local_48);
    std::vector<double,_std::allocator<double>_>::push_back(&this->container__,&local_28);
    boost::python::extract<double>::~extract(&local_48);
    boost::python::api::object::~object(&local_50);
    boost::python::api::proxy<boost::python::api::item_policies>::~proxy(&local_60);
  }
  return;
}

Assistant:

vector(boost::python::list vec): max_size__{static_cast<size_t>(boost::python::len(vec))} {
          for(size_t i = 0 ; i < max_size__; i++) container__.push_back(boost::python::extract<element_t>(vec[i]));
      }